

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall ON_Mesh::ON_Mesh(ON_Mesh *this,ON_Mesh *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_Interval *local_a8;
  ON_Interval *local_90;
  ON_Mesh *src_local;
  ON_Mesh *this_local;
  
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00b72c40;
  ON_3dPointArray::ON_3dPointArray(&this->m_dV);
  ON_3fPointArray::ON_3fPointArray(&this->m_V);
  ON_SimpleArray<ON_MeshFace>::ON_SimpleArray(&this->m_F);
  ON_SimpleArray<unsigned_int>::ON_SimpleArray(&this->m_NgonMap);
  ON_SimpleArray<ON_MeshNgon_*>::ON_SimpleArray(&this->m_Ngon);
  ON_MeshNgonAllocator::ON_MeshNgonAllocator(&this->m_NgonAllocator);
  ON_3fVectorArray::ON_3fVectorArray(&this->m_N);
  ON_3fVectorArray::ON_3fVectorArray(&this->m_FN);
  ON_MappingTag::ON_MappingTag(&this->m_Ttag);
  ON_2fPointArray::ON_2fPointArray(&this->m_T);
  ON_ClassArray<ON_TextureCoordinates>::ON_ClassArray(&this->m_TC);
  ON_2dPointArray::ON_2dPointArray(&this->m_S);
  local_90 = (ON_Interval *)&this->field_0x240;
  do {
    ON_Interval::ON_Interval(local_90);
    local_90 = local_90 + 1;
  } while (local_90 != (ON_Interval *)this->m_srf_scale);
  local_a8 = (ON_Interval *)&this->field_0x270;
  do {
    ON_Interval::ON_Interval(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != (ON_Interval *)&this->m_packed_tex_rotate);
  this->m_packed_tex_rotate = false;
  ON_SimpleArray<ON_SurfaceCurvature>::ON_SimpleArray(&this->m_K);
  ON_MappingTag::ON_MappingTag(&this->m_Ctag);
  ON_SimpleArray<ON_Color>::ON_SimpleArray(&this->m_C);
  ON_SimpleArray<bool>::ON_SimpleArray(&this->m_H);
  this->m_parent = (ON_Object *)0x0;
  ON_MeshTopology::ON_MeshTopology(&this->m_top);
  this->m_mesh_parameters = (ON_MeshParameters *)0x0;
  this->m_invalid_count = 0;
  this->m_quad_count = 0;
  this->m_triangle_count = 0;
  this->m_mesh_is_closed = '\0';
  this->m_mesh_is_manifold = '\0';
  this->m_mesh_is_oriented = '\0';
  this->m_mesh_is_solid = '\0';
  dVar5 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
  dVar4 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
  dVar3 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
  dVar2 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
  dVar1 = ON_BoundingBox::UnsetBoundingBox.m_min.x;
  (this->m_vertex_bbox).m_max.y = ON_BoundingBox::UnsetBoundingBox.m_max.y;
  (this->m_vertex_bbox).m_max.z = dVar5;
  (this->m_vertex_bbox).m_min.z = dVar3;
  (this->m_vertex_bbox).m_max.x = dVar4;
  (this->m_vertex_bbox).m_min.x = dVar1;
  (this->m_vertex_bbox).m_min.y = dVar2;
  ON_BoundingBoxCache::ON_BoundingBoxCache(&this->m_tight_bbox_cache);
  (this->m_top).m_mesh = this;
  this->m_srf_scale[0] = 0.0;
  this->m_srf_scale[1] = 0.0;
  this->m_kstat[0] = (ON_MeshCurvatureStats *)0x0;
  this->m_kstat[1] = (ON_MeshCurvatureStats *)0x0;
  this->m_kstat[2] = (ON_MeshCurvatureStats *)0x0;
  this->m_kstat[3] = (ON_MeshCurvatureStats *)0x0;
  InvalidateBoundingBoxes(this);
  this->m_partition = (ON_MeshPartition *)0x0;
  this->m_hidden_count = 0;
  operator=(this,src);
  return;
}

Assistant:

ON_Mesh::ON_Mesh( const ON_Mesh& src ) 
: m_packed_tex_rotate(0)
, m_parent(0) 
, m_mesh_parameters(0) 
, m_invalid_count(0) 
, m_quad_count(0) 
, m_triangle_count(0)
, m_mesh_is_closed(0)
, m_mesh_is_manifold(0)
, m_mesh_is_oriented(0)
, m_mesh_is_solid(0)
{
  // Do not copy m_mesh_cache. Cached information will
  // be recalculated if it is needed.
  m_top.m_mesh = this;
  m_srf_scale[0] = 0.0;
  m_srf_scale[1] = 0.0;

  m_kstat[0] = 0;
  m_kstat[1] = 0;
  m_kstat[2] = 0;
  m_kstat[3] = 0;
  InvalidateBoundingBoxes();
  m_partition = 0;
  m_hidden_count = 0;
  ON_Mesh::operator=(src);
}